

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapetetra.cpp
# Opt level: O2

void pzshape::TPZShapeTetra::ShapeInternal
               (int side,TPZVec<double> *x,int order,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi)

{
  ostream *poVar1;
  
  if (side - 0xfU < 0xfffffff5) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapetetra.cpp"
               ,0x178);
  }
  if (side - 4U < 6) {
    TPZShapeLinear::ShapeInternal(x,order,phi,dphi);
    return;
  }
  if (side - 10U < 4) {
    TPZShapeTriang::ShapeInternal(x,order,phi,dphi);
    return;
  }
  if (side == 0xe) {
    ShapeInternal(x,order,phi,dphi);
    return;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"Wrong side parameter side ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,side);
  std::endl<char,std::char_traits<char>>(poVar1);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/pzshapetetra.cpp"
             ,0x19b);
}

Assistant:

void TPZShapeTetra::ShapeInternal(int side, TPZVec<REAL> &x, int order,
                                      TPZFMatrix<REAL> &phi, TPZFMatrix<REAL> &dphi){
        if (side < 4 || side > 14) {
            DebugStop();
        }
        
        switch (side) {
                
            case 4:
            case 5:
            case 6:
            case 7:
            case 8:
            case 9:
            {
                pzshape::TPZShapeLinear::ShapeInternal(x, order, phi, dphi);
            }
                break;
                
            case 10:
            case 11:
            case 12:
            case 13:
                
            {
                pzshape::TPZShapeTriang::ShapeInternal(x, order, phi, dphi);
            }
                break;
                
            case 14:
            {

               ShapeInternal(x, order, phi, dphi);
            }
                break;
                
            default:
                std::cout << "Wrong side parameter side " << side << std::endl;
                DebugStop();
                break;
        }

    }